

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

bool __thiscall EOClient::Upload(EOClient *this,FileType type,int id,InitReply init_reply)

{
  World *pWVar1;
  uint uVar2;
  bool bVar3;
  EOServer *pEVar4;
  mapped_type *this_00;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  ECF local_200;
  ESF local_1c8;
  ENF local_190;
  undefined4 local_154;
  EIF local_150;
  allocator<char> local_111;
  key_type local_110;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char local_7f [7];
  size_t *psStack_78;
  char mapbuf [7];
  anon_class_24_3_6b07fd1b load_file_splits;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *file_splits;
  size_t file_length;
  size_t file_start;
  string filename;
  uint local_20;
  InitReply init_reply_local;
  int id_local;
  FileType type_local;
  EOClient *this_local;
  
  this->upload_file_id = id;
  filename.field_2._M_local_buf[0xf] = init_reply;
  local_20 = id;
  init_reply_local = type;
  _id_local = this;
  std::__cxx11::string::string((string *)&file_start);
  file_length = 0;
  file_splits = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  load_file_splits.id = (int *)0x0;
  psStack_78 = &file_start;
  load_file_splits.filename = (string *)&load_file_splits.id;
  load_file_splits.file_splits = (vector<unsigned_long,_std::allocator<unsigned_long>_> **)&local_20
  ;
  if (init_reply_local == INIT_OUT_OF_DATE) {
    uVar2 = local_20;
    if ((int)local_20 < 1) {
      uVar2 = -local_20;
    }
    sprintf(local_7f,"%05i",(ulong)uVar2);
    pEVar4 = server(this);
    pWVar1 = pEVar4->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"MapDir",&local_111);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_110);
    util::variant::operator_cast_to_string(&local_e0,this_00);
    std::operator+(&local_c0,&local_e0,local_7f);
    std::operator+(&local_a0,&local_c0,".emf");
    std::__cxx11::string::operator=((string *)&file_start,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  else if (init_reply_local == INIT_OK) {
    pEVar4 = server(this);
    EIF::EIF(&local_150,pEVar4->world->eif);
    bVar3 = Upload(FileType,int,InitReply)::$_0::operator()
                      ((__0 *)&stack0xffffffffffffff88,&local_150);
    EIF::~EIF(&local_150);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015e9af;
    }
  }
  else if (init_reply_local == INIT_BANNED) {
    pEVar4 = server(this);
    ENF::ENF(&local_190,pEVar4->world->enf);
    bVar3 = Upload(FileType,int,InitReply)::$_0::operator()
                      ((__0 *)&stack0xffffffffffffff88,&local_190);
    ENF::~ENF(&local_190);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015e9af;
    }
  }
  else if (init_reply_local == INIT_FILE_MAP) {
    pEVar4 = server(this);
    ESF::ESF(&local_1c8,pEVar4->world->esf);
    bVar3 = Upload(FileType,int,InitReply)::$_0::operator()
                      ((__0 *)&stack0xffffffffffffff88,&local_1c8);
    ESF::~ESF(&local_1c8);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015e9af;
    }
  }
  else if (init_reply_local == INIT_FILE_EIF) {
    pEVar4 = server(this);
    ECF::ECF(&local_200,pEVar4->world->ecf);
    bVar3 = Upload(FileType,int,InitReply)::$_0::operator()
                      ((__0 *)&stack0xffffffffffffff88,&local_200);
    ECF::~ECF(&local_200);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015e9af;
    }
  }
  if (load_file_splits.id != (int *)0x0) {
    if (((int)local_20 < 1) ||
       (uVar5 = (ulong)(int)local_20,
       sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          load_file_splits.id), sVar6 <= uVar5)) {
      this_local._7_1_ = false;
      goto LAB_0015e9af;
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)load_file_splits.id
                        ,(long)(int)(local_20 - 1));
    file_length = *pvVar7;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)load_file_splits.id
                        ,(long)(int)local_20);
    file_splits = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*pvVar7 - file_length);
  }
  this_local._7_1_ =
       Upload(this,init_reply_local,(string *)&file_start,file_length,(size_t)file_splits,
              filename.field_2._M_local_buf[0xf]);
LAB_0015e9af:
  local_154 = 1;
  std::__cxx11::string::~string((string *)&file_start);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool EOClient::Upload(FileType type, int id, InitReply init_reply)
{
	this->upload_file_id = id;

	std::string filename;
	std::size_t file_start = 0;
	std::size_t file_length = 0;

	std::vector<std::size_t>* file_splits = nullptr;

	auto load_file_splits = [&](auto pub)
	{
		if (pub.files.empty())
			return false;

		Pub_File& first_file = pub.files[0];

		if (pub.files.size() == 1 && first_file.splits.size() > 2)
		{
			filename = first_file.filename;
			file_splits = &first_file.splits;
		}
		else
		{
			if (id - 1 < 0 || id - 1 > pub.files.size())
				return false;

			filename = pub.files[id - 1].filename;
		}

		return true;
	};

	if (type == FILE_MAP)
	{
		char mapbuf[7];
		std::sprintf(mapbuf, "%05i", int(std::abs(id)));
		filename = std::string(server()->world->config["MapDir"]) + mapbuf + ".emf";
	}
	else if (type == FILE_ITEM)
	{
		if (!load_file_splits(*this->server()->world->eif))
			return false;
	}
	else if (type == FILE_NPC)
	{
		if (!load_file_splits(*this->server()->world->enf))
			return false;
	}
	else if (type == FILE_SPELL)
	{
		if (!load_file_splits(*this->server()->world->esf))
			return false;
	}
	else if (type == FILE_CLASS)
	{
		if (!load_file_splits(*this->server()->world->ecf))
			return false;
	}

	if (file_splits)
	{
		if (id < 1 || id >= file_splits->size())
			return false;

		file_start = (*file_splits)[id - 1];
		file_length = (*file_splits)[id] - file_start;
	}

	return EOClient::Upload(type, filename, file_start, file_length, init_reply);
}